

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>
          (Promise<void> *this,Own<kj::AsyncInputStream> *attachments,String *attachments_1,
          Own<kj::HttpHeaders> *attachments_2)

{
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
  *pAVar1;
  PromiseNode *extraout_RDX;
  String *in_R8;
  Promise<void> PVar2;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
  local_70;
  Own<kj::_::PromiseNode> local_60;
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  local_50;
  
  tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
              *)&local_50,(kj *)attachments_1,(Own<kj::AsyncInputStream> *)attachments_2,in_R8,
             (Own<kj::HttpHeaders> *)in_R8);
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>
            ((kj *)&local_70,(Own<kj::_::PromiseNode> *)attachments,
             (Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_> *)
             &local_50);
  pAVar1 = local_70.ptr;
  local_60.disposer = local_70.disposer;
  local_70.ptr = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>
                  *)0x0;
  (this->super_PromiseBase).node.disposer = local_70.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)pAVar1;
  local_60.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_60);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>_>_>
  ::dispose(&local_70);
  _::
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  ::~TupleImpl(&local_50);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}